

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O2

void Am_Copy_Data_Into_Slot(Am_Object *dest_obj,Am_Slot_Key dest_slot,Am_Inter_Location *src_data)

{
  Am_Value_Type AVar1;
  Am_Value *in_value;
  Am_Wrapper *value;
  Am_Inter_Location dest_data;
  
  AVar1 = Am_Object::Get_Slot_Type(dest_obj,dest_slot,0);
  if ((AVar1 & 0x7000) == 0x2000) {
    Am_Inter_Location::Am_Inter_Location(&dest_data);
    Am_Object::Make_Unique(dest_obj,dest_slot);
    in_value = Am_Object::Get(dest_obj,dest_slot,0);
    Am_Inter_Location::operator=(&dest_data,in_value);
    Am_Inter_Location::Copy_From(&dest_data,src_data,false);
    Am_Object::Note_Changed(dest_obj,dest_slot);
  }
  else {
    Am_Inter_Location::Copy(&dest_data);
    value = Am_Inter_Location::operator_cast_to_Am_Wrapper_(&dest_data);
    Am_Object::Set(dest_obj,dest_slot,value,1);
  }
  Am_Inter_Location::~Am_Inter_Location(&dest_data);
  return;
}

Assistant:

void
Am_Copy_Data_Into_Slot(Am_Object dest_obj, Am_Slot_Key dest_slot,
                       Am_Inter_Location src_data)
{
  if (Am_Type_Class(dest_obj.Get_Slot_Type(dest_slot)) == Am_WRAPPER) {
    // then just copy the new data into the old data
    Am_Inter_Location dest_data;
    dest_obj.Make_Unique(dest_slot);
    dest_data = dest_obj.Get(dest_slot);
    dest_data.Copy_From(src_data, false);
    dest_obj.Note_Changed(dest_slot); //since destructively modified
  } else                              //set slot with a copy of data
    dest_obj.Set(dest_slot, src_data.Copy(), Am_OK_IF_NOT_THERE);
}